

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteEnumValueDocComment
               (Printer *printer,EnumValueDescriptor *value,Options *options)

{
  bool bVar1;
  char *pcVar2;
  string_view text;
  string_view text_00;
  string_view input;
  Options local_140;
  SourceLocation location;
  string local_88;
  Options local_68;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  Options::Options(&local_68,options);
  location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
  location.leading_comments._M_string_length = 0;
  pcVar2 = (char *)0x0;
  location.leading_comments.field_2._M_local_buf[0] = '\0';
  location.trailing_comments._M_dataplus._M_p = (pointer)&location.trailing_comments.field_2;
  location.trailing_comments._M_string_length = 0;
  location.trailing_comments.field_2._M_local_buf[0] = '\0';
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = EnumValueDescriptor::GetSourceLocation(value,&location);
  if (bVar1) {
    Options::Options(&local_140,&local_68);
    pcVar2 = (char *)0x0;
    WriteDocCommentBodyForLocation(printer,&location,&local_140,false);
    Options::~Options(&local_140);
  }
  SourceLocation::~SourceLocation(&location);
  Options::~Options(&local_68);
  EnumValueDescriptor::DebugString_abi_cxx11_(&local_88,value);
  FirstLineOf((string *)&local_140,&local_88);
  input._M_str = pcVar2;
  input._M_len._0_1_ = local_140.generate_immutable_code;
  input._M_len._1_1_ = local_140.generate_mutable_code;
  input._M_len._2_1_ = local_140.generate_shared_code;
  input._M_len._3_1_ = local_140.enforce_lite;
  input._M_len._4_1_ = local_140.opensource_runtime;
  input._M_len._5_1_ = local_140.annotate_code;
  input._M_len._6_2_ = local_140._6_2_;
  EscapeJavadoc_abi_cxx11_
            ((string *)&location,(java *)local_140.annotation_list_file._M_dataplus._M_p,input);
  text_00._M_str = " * <code>$def$</code>\n */\n";
  text_00._M_len = 0x1a;
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,text_00,(char (*) [4])0xf79cec,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&location);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void WriteEnumValueDocComment(io::Printer* printer,
                              const EnumValueDescriptor* value,
                              const Options options) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, value, options, /* kdoc */ false);

  printer->Print(
      " * <code>$def$</code>\n"
      " */\n",
      "def", EscapeJavadoc(FirstLineOf(value->DebugString())));
}